

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

block_state deflate_fast(deflate_state *s,int flush)

{
  ushort uVar1;
  Posf *pPVar2;
  Posf *pPVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  uInt uVar7;
  uint uVar8;
  int iVar9;
  IPos cur_match;
  Bytef *pBVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      if (flush == 0 && s->lookahead < 0x106) {
        return need_more;
      }
      if (s->lookahead == 0) {
        uVar11 = s->strstart;
        uVar6 = 2;
        if (uVar11 < 2) {
          uVar6 = uVar11;
        }
        s->insert = uVar6;
        if (flush != 4) {
          if (s->sym_next != 0) {
            uVar4 = s->block_start;
            if ((long)uVar4 < 0) {
              pBVar10 = (Bytef *)0x0;
            }
            else {
              pBVar10 = s->window + (uVar4 & 0xffffffff);
            }
            _tr_flush_block(s,(charf *)pBVar10,uVar11 - uVar4,0);
            s->block_start = (ulong)s->strstart;
            flush_pending(s->strm);
            if (s->strm->avail_out == 0) {
              return need_more;
            }
          }
          return block_done;
        }
        uVar4 = s->block_start;
        if ((long)uVar4 < 0) {
          pBVar10 = (Bytef *)0x0;
        }
        else {
          pBVar10 = s->window + (uVar4 & 0xffffffff);
        }
        _tr_flush_block(s,(charf *)pBVar10,uVar11 - uVar4,1);
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        return finish_done - (s->strm->avail_out == 0);
      }
    }
    cur_match = 0;
    if (2 < s->lookahead) {
      uVar11 = s->strstart;
      uVar6 = uVar11 & 0xffff;
      uVar8 = *(int *)(s->window + uVar6) * 0x103d9 + 0x103d9U >> 0x10 & s->hash_mask;
      s->ins_h = uVar8;
      pPVar2 = s->head;
      uVar1 = pPVar2[uVar8];
      cur_match = (IPos)uVar1;
      s->prev[s->w_mask & uVar6] = uVar1;
      pPVar2[uVar8] = (Posf)uVar11;
    }
    if ((cur_match != 0) && (s->strstart - cur_match <= s->w_size - 0x106)) {
      uVar7 = longest_match(s,cur_match);
      s->match_length = uVar7;
    }
    if (s->match_length < 3) {
      bVar5 = s->window[s->strstart];
      uVar11 = s->sym_next;
      s->d_buf[uVar11] = 0;
      s->sym_next = uVar11 + 1;
      s->l_buf[uVar11] = bVar5;
      s->dyn_ltree[bVar5].fc.freq = s->dyn_ltree[bVar5].fc.freq + 1;
      bVar14 = s->sym_next == s->sym_end;
      s->lookahead = s->lookahead - 1;
      s->strstart = s->strstart + 1;
    }
    else {
      bVar5 = (char)s->match_length - 3;
      iVar9 = s->strstart - s->match_start;
      uVar11 = s->sym_next;
      s->d_buf[uVar11] = (ushf)iVar9;
      s->sym_next = uVar11 + 1;
      s->l_buf[uVar11] = bVar5;
      uVar8 = iVar9 - 1;
      s->dyn_ltree[(ulong)""[bVar5] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar5] + 0x101].fc.freq + 1;
      uVar6 = uVar8 & 0xffff;
      uVar11 = (uVar6 >> 7) + 0x100;
      if (uVar6 < 0x100) {
        uVar11 = uVar8;
      }
      s->dyn_dtree[""[uVar11 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar11 & 0xffff]].fc.freq + 1;
      bVar14 = s->sym_next == s->sym_end;
      uVar11 = s->match_length;
      uVar6 = s->lookahead - uVar11;
      s->lookahead = uVar6;
      if (uVar6 < 3 || s->max_lazy_match < uVar11) {
        uVar11 = uVar11 + s->strstart;
        s->strstart = uVar11;
        s->match_length = 0;
        if (s->chromium_zlib_hash == 0) {
          uVar6 = (uint)s->window[uVar11];
          s->ins_h = uVar6;
          s->ins_h = ((uint)s->window[uVar11 + 1] ^ uVar6 << ((byte)s->hash_shift & 0x1f)) &
                     s->hash_mask;
        }
      }
      else {
        s->match_length = uVar11 - 1;
        pBVar10 = s->window;
        uVar6 = s->hash_mask;
        pPVar2 = s->head;
        pPVar3 = s->prev;
        uVar8 = s->w_mask;
        uVar7 = uVar11 - 2;
        uVar11 = s->strstart + 1;
        do {
          s->strstart = uVar11;
          uVar12 = *(int *)(pBVar10 + (uVar11 & 0xffff)) * 0x103d9 + 0x103d9U >> 0x10 & uVar6;
          s->ins_h = uVar12;
          pPVar3[uVar11 & 0xffff & uVar8] = pPVar2[uVar12];
          pPVar2[uVar12] = (Posf)uVar11;
          s->match_length = uVar7;
          uVar11 = uVar11 + 1;
          bVar13 = uVar7 != 0;
          uVar7 = uVar7 - 1;
        } while (bVar13);
        s->strstart = uVar11;
      }
    }
    if (bVar14) {
      uVar4 = s->block_start;
      if ((long)uVar4 < 0) {
        pBVar10 = (Bytef *)0x0;
      }
      else {
        pBVar10 = s->window + (uVar4 & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)pBVar10,s->strstart - uVar4,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_fast(deflate_state *s, int flush) {
    IPos hash_head;       /* head of the hash chain */
    int bflush;           /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart + 2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        hash_head = NIL;
        if (s->lookahead >= MIN_MATCH) {
            hash_head = insert_string(s, s->strstart);
        }

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            s->match_length = longest_match (s, hash_head);
            /* longest_match() sets match_start */
        }
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->match_start, s->match_length);

            _tr_tally_dist(s, s->strstart - s->match_start,
                           s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
#ifndef FASTEST
            if (s->match_length <= s->max_insert_length &&
                s->lookahead >= MIN_MATCH) {
                s->match_length--; /* string at strstart already in table */
                do {
                    s->strstart++;
                    hash_head = insert_string(s, s->strstart);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
                } while (--s->match_length != 0);
                s->strstart++;
            } else
#endif
            {
                s->strstart += s->match_length;
                s->match_length = 0;

                if (!s->chromium_zlib_hash) {
                  s->ins_h = s->window[s->strstart];
                  UPDATE_HASH(s, s->ins_h, s->window[s->strstart + 1]);
#if MIN_MATCH != 3
                  Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
                  /* If lookahead < MIN_MATCH, ins_h is garbage, but it does not
                   * matter since it will be recomputed at next deflate call.
                   */
                }
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit(s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < MIN_MATCH-1 ? s->strstart : MIN_MATCH-1;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}